

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spvIR.h
# Opt level: O0

void __thiscall
spv::Function::Function
          (Function *this,Id id,Id resultType,Id functionType,Id firstParamId,Module *parent)

{
  int iVar1;
  Id resultId;
  Id typeId;
  Instruction *this_00;
  value_type *__x;
  Instruction *local_50;
  Instruction *param;
  int p;
  int numParams;
  Instruction *typeInst;
  Module *local_28;
  Module *parent_local;
  Id firstParamId_local;
  Id functionType_local;
  Id resultType_local;
  Id id_local;
  Function *this_local;
  
  this->_vptr_Function = (_func_int **)&PTR__Function_00339d68;
  this->parent = parent;
  local_28 = parent;
  parent_local._0_4_ = firstParamId;
  parent_local._4_4_ = functionType;
  firstParamId_local = resultType;
  functionType_local = id;
  _resultType_local = this;
  Instruction::Instruction(&this->functionInstruction,id,resultType,OpFunction);
  std::vector<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>::vector
            (&this->parameterInstructions);
  std::vector<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>::vector(&this->blocks);
  this->implicitThis = false;
  Instruction::addImmediateOperand(&this->functionInstruction,0);
  Instruction::addIdOperand(&this->functionInstruction,parent_local._4_4_);
  Module::mapInstruction(local_28,&this->functionInstruction);
  Module::addFunction(local_28,this);
  __x = (value_type *)(ulong)parent_local._4_4_;
  _p = Module::getInstruction(local_28,parent_local._4_4_);
  iVar1 = Instruction::getNumOperands(_p);
  param._4_4_ = iVar1 + -1;
  for (param._0_4_ = 0; (int)param < param._4_4_; param._0_4_ = (int)param + 1) {
    this_00 = (Instruction *)Instruction::operator_new((Instruction *)0x38,(size_t)__x);
    resultId = (Id)parent_local + (int)param;
    typeId = Instruction::getIdOperand(_p,(int)param + 1);
    Instruction::Instruction(this_00,resultId,typeId,OpFunctionParameter);
    local_50 = this_00;
    Module::mapInstruction(local_28,this_00);
    __x = &local_50;
    std::vector<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>::push_back
              (&this->parameterInstructions,__x);
  }
  return;
}

Assistant:

__inline Function::Function(Id id, Id resultType, Id functionType, Id firstParamId, Module& parent)
    : parent(parent), functionInstruction(id, resultType, OpFunction), implicitThis(false)
{
    // OpFunction
    functionInstruction.addImmediateOperand(FunctionControlMaskNone);
    functionInstruction.addIdOperand(functionType);
    parent.mapInstruction(&functionInstruction);
    parent.addFunction(this);

    // OpFunctionParameter
    Instruction* typeInst = parent.getInstruction(functionType);
    int numParams = typeInst->getNumOperands() - 1;
    for (int p = 0; p < numParams; ++p) {
        Instruction* param = new Instruction(firstParamId + p, typeInst->getIdOperand(p + 1), OpFunctionParameter);
        parent.mapInstruction(param);
        parameterInstructions.push_back(param);
    }
}